

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::parent_path(path *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  iterator __begin4;
  string_type s;
  iterator __end4;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  const_iterator local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  input_iterator_range<ghc::filesystem::path::iterator> local_b8;
  const_iterator local_38;
  
  bVar5 = has_relative_path(this);
  if (bVar5) {
    sVar1 = (this->_path)._M_string_length;
    if (sVar1 != 0) {
      local_168._0_8_ = (this->_path)._M_dataplus._M_p;
      local_f8._0_8_ = local_168._0_8_ + sVar1;
      local_118._M_dataplus._M_p = (pointer)local_168._0_8_;
      iterator::iterator(&local_b8._first,(const_iterator *)local_168,(const_iterator *)local_f8,
                         (const_iterator *)&local_118);
      local_f8._0_8_ = (this->_path)._M_dataplus._M_p;
      local_120._M_current = (char *)(local_f8._0_8_ + (this->_path)._M_string_length);
      local_118._M_dataplus._M_p = local_120._M_current;
      iterator::iterator((iterator *)local_168,(const_iterator *)local_f8,
                         (const_iterator *)&local_118,&local_120);
      local_168._24_8_ =
           iterator::decrement((iterator *)local_168,(const_iterator *)(local_168 + 0x18));
      iterator::updateCurrent((iterator *)local_168);
      uVar4 = local_168._24_8_;
      pcVar3 = (char *)CONCAT44(local_b8._first._iter._M_current._4_4_,
                                local_b8._first._iter._M_current._0_4_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_p != &local_138) {
        operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._first._current._path._M_dataplus._M_p !=
          &local_b8._first._current._path.field_2) {
        operator_delete(local_b8._first._current._path._M_dataplus._M_p,
                        local_b8._first._current._path.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)uVar4) {
        local_128 = &(__return_storage_ptr__->_path).field_2;
        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_128;
        (__return_storage_ptr__->_path)._M_string_length = 0;
        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
        local_120._M_current = (this->_path)._M_dataplus._M_p;
        local_118._M_dataplus._M_p = local_120._M_current + (this->_path)._M_string_length;
        local_f8._0_8_ = local_120._M_current;
        iterator::iterator((iterator *)local_168,(const_iterator *)local_f8,
                           (const_iterator *)&local_118,&local_120);
        local_118._M_dataplus._M_p = (this->_path)._M_dataplus._M_p;
        local_120._M_current = local_118._M_dataplus._M_p + (this->_path)._M_string_length;
        local_38._M_current = local_120._M_current;
        iterator::iterator((iterator *)local_f8,(const_iterator *)&local_118,&local_120,&local_38);
        local_f8._24_8_ =
             iterator::decrement((iterator *)local_f8,(const_iterator *)(local_f8 + 0x18));
        iterator::updateCurrent((iterator *)local_f8);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  (&local_b8,(iterator *)local_168,(iterator *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_p != &local_138) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        local_168._16_4_ = local_b8._first._root._M_current._0_4_;
        local_168._20_4_ = local_b8._first._root._M_current._4_4_;
        local_168._28_4_ = local_b8._first._iter._M_current._4_4_;
        local_168._24_4_ = local_b8._first._iter._M_current._0_4_;
        local_168._8_4_ = local_b8._first._last._M_current._0_4_;
        local_168._12_4_ = local_b8._first._last._M_current._4_4_;
        local_148._M_p = (pointer)&local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,local_b8._first._current._path._M_dataplus._M_p,
                   local_b8._first._current._path._M_dataplus._M_p +
                   local_b8._first._current._path._M_string_length);
        local_f8._16_4_ = local_b8._last._root._M_current._0_4_;
        local_f8._20_4_ = local_b8._last._root._M_current._4_4_;
        local_f8._28_4_ = local_b8._last._iter._M_current._4_4_;
        local_f8._24_4_ = local_b8._last._iter._M_current._0_4_;
        local_f8._8_4_ = local_b8._last._last._M_current._0_4_;
        local_f8._12_4_ = local_b8._last._last._M_current._4_4_;
        local_d8._M_p = (pointer)&local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_b8._last._current._path._M_dataplus._M_p,
                   local_b8._last._current._path._M_dataplus._M_p +
                   local_b8._last._current._path._M_string_length);
        while (local_168._24_8_ != local_f8._24_8_) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_148._M_p,local_148._M_p + local_140);
          iVar6 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar6 == 0) {
            operator+=(__return_storage_ptr__,&local_118);
          }
          else {
            append<std::__cxx11::string>(__return_storage_ptr__,&local_118);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          iterator::operator++((iterator *)local_168);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_p != &local_138) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._last._current._path._M_dataplus._M_p !=
            &local_b8._last._current._path.field_2) {
          operator_delete(local_b8._last._current._path._M_dataplus._M_p,
                          local_b8._last._current._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._first._current._path._M_dataplus._M_p ==
            &local_b8._first._current._path.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_b8._first._current._path._M_dataplus._M_p,
                        local_b8._first._current._path.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    pcVar2 = (this->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->_path)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::parent_path() const
{
    if (has_relative_path()) {
        if (empty() || begin() == --end()) {
            return path();
        }
        else {
            path pp;
            for (string_type s : input_iterator_range<iterator>(begin(), --end())) {
                if (s == "/") {
                    // don't use append to join a path-
                    pp += s;
                }
                else {
                    pp /= s;
                }
            }
            return pp;
        }
    }
    else {
        return *this;
    }
}